

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

int32_t __thiscall
icu_63::UnicodeString::doLastIndexOf(UnicodeString *this,UChar c,int32_t start,int32_t length)

{
  uint uVar1;
  UChar *pUVar2;
  char16_t *pcVar3;
  int32_t length_local;
  int32_t start_local;
  
  if ((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x1) ==
      (undefined1  [56])0x0) {
    length_local = length;
    start_local = start;
    pinIndices(this,&start_local,&length_local);
    if (((this->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
      pcVar3 = (this->fUnion).fFields.fArray;
    }
    else {
      pcVar3 = (char16_t *)((long)&this->fUnion + 2);
    }
    pUVar2 = u_memrchr_63(pcVar3 + start_local,c,length_local);
    uVar1 = -(uint)(pUVar2 == (UChar *)0x0) | (uint)((ulong)((long)pUVar2 - (long)pcVar3) >> 1);
  }
  else {
    uVar1 = 0xffffffff;
  }
  return uVar1;
}

Assistant:

int32_t
UnicodeString::doLastIndexOf(UChar c,
                 int32_t start,
                 int32_t length) const
{
  if(isBogus()) {
    return -1;
  }

  // pin indices
  pinIndices(start, length);

  // find the last occurrence of c
  const UChar *array = getArrayStart();
  const UChar *match = u_memrchr(array + start, c, length);
  if(match == NULL) {
    return -1;
  } else {
    return (int32_t)(match - array);
  }
}